

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O3

void __thiscall
beagle::cpu::EigenDecompositionSquare<float,_1>::updateTransitionMatrices
          (EigenDecompositionSquare<float,_1> *this,int eigenIndex,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          double *categoryRates,float **transitionMatrices,int count)

{
  float *pfVar1;
  double dVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined1 auVar8 [16];
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  float *pfVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  float *pfVar17;
  ulong uVar18;
  float *pfVar19;
  int k;
  ulong uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  float fVar25;
  float fVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  
  if (0 < count) {
    uVar12 = (ulong)(uint)(this->super_EigenDecomposition<float,_1>).kCategoryCount;
    pfVar4 = this->gIMatrices[eigenIndex];
    pfVar5 = (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndex];
    pfVar6 = this->gEMatrices[eigenIndex];
    uVar9 = (ulong)(this->super_EigenDecomposition<float,_1>).kStateCount;
    uVar14 = 0;
    uVar10 = uVar9;
    do {
      if (0 < (int)uVar12) {
        lVar24 = 0;
        iVar21 = 0;
        pfVar7 = transitionMatrices[probabilityIndices[uVar14]];
        dVar2 = edgeLengths[uVar14];
        do {
          if (0 < (int)uVar10) {
            iVar22 = 0;
            fVar25 = (float)(dVar2 * categoryRates[lVar24]);
            do {
              if (this->isComplex == true) {
                fVar26 = pfVar5[uVar9 + (long)iVar22];
                if ((fVar26 == 0.0) && (!NAN(fVar26))) goto LAB_0013e0d1;
                iVar23 = iVar22 + 1;
                dVar28 = exp((double)(fVar25 * pfVar5[iVar22]));
                dVar27 = cos((double)(fVar25 * fVar26));
                dVar29 = sin((double)(fVar25 * fVar26));
                iVar3 = (this->super_EigenDecomposition<float,_1>).kStateCount;
                uVar10 = (ulong)iVar3;
                if (0 < (long)uVar10) {
                  pfVar13 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                  lVar11 = (long)(iVar3 * iVar23);
                  lVar16 = (long)(iVar22 * iVar3);
                  uVar12 = 0;
                  dVar27 = (double)(float)dVar28 * dVar27;
                  auVar30._0_4_ = (float)dVar27;
                  auVar30._4_4_ = (int)((ulong)dVar27 >> 0x20);
                  auVar30._8_8_ = 0;
                  fVar26 = (float)(dVar29 * (double)(float)dVar28);
                  do {
                    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * pfVar4[lVar11 + uVar12])),
                                             auVar30,ZEXT416((uint)pfVar4[lVar16 + uVar12]));
                    pfVar13[lVar16 + uVar12] = auVar8._0_4_;
                    auVar8 = vfmsub231ss_fma(ZEXT416((uint)(fVar26 * pfVar4[lVar16 + uVar12])),
                                             auVar30,ZEXT416((uint)pfVar4[lVar11 + uVar12]));
                    pfVar13[lVar11 + uVar12] = auVar8._0_4_;
                    uVar12 = uVar12 + 1;
                  } while (uVar10 != uVar12);
                }
              }
              else {
LAB_0013e0d1:
                dVar27 = exp((double)(fVar25 * pfVar5[iVar22]));
                iVar3 = (this->super_EigenDecomposition<float,_1>).kStateCount;
                uVar10 = (ulong)iVar3;
                iVar23 = iVar22;
                if (0 < (long)uVar10) {
                  uVar12 = 0;
                  lVar11 = (long)(iVar3 * iVar22);
                  pfVar13 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                  do {
                    pfVar13[lVar11 + uVar12] = (float)dVar27 * pfVar4[lVar11 + uVar12];
                    uVar12 = uVar12 + 1;
                  } while (uVar10 != uVar12);
                }
              }
              iVar22 = iVar23 + 1;
            } while (iVar22 < (int)uVar10);
            if (0 < (int)uVar10) {
              uVar12 = uVar10 & 0xffffffff;
              uVar15 = 0;
              pfVar13 = pfVar6;
              do {
                pfVar17 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                uVar18 = 0;
                lVar11 = (long)iVar21;
                do {
                  lVar16 = lVar11;
                  auVar30 = ZEXT816(0) << 0x40;
                  uVar20 = 0;
                  pfVar19 = pfVar17;
                  do {
                    pfVar1 = pfVar13 + uVar20;
                    uVar20 = uVar20 + 1;
                    auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)*pfVar1),ZEXT416((uint)*pfVar19)
                                             );
                    pfVar19 = pfVar19 + uVar12;
                  } while (uVar12 != uVar20);
                  auVar30 = vmaxss_avx(auVar30,ZEXT816(0) << 0x40);
                  uVar18 = uVar18 + 1;
                  pfVar17 = pfVar17 + 1;
                  pfVar7[lVar16] = auVar30._0_4_;
                  lVar11 = lVar16 + 1;
                } while (uVar18 != uVar12);
                iVar21 = (int)lVar16 + 2;
                uVar15 = uVar15 + 1;
                pfVar13 = pfVar13 + uVar12;
                pfVar7[(int)(lVar16 + 1)] = 1.0;
              } while (uVar15 != uVar12);
            }
          }
          uVar12 = (ulong)(this->super_EigenDecomposition<float,_1>).kCategoryCount;
          lVar24 = lVar24 + 1;
        } while (lVar24 < (long)uVar12);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != (uint)count);
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatrices(int eigenIndex,
                                                        const int* probabilityIndices,
                                                        const int* firstDerivativeIndices,
                                                        const int* secondDerivativeIndices,
                                                        const double* edgeLengths,
                                                        const double* categoryRates,
                                                        REALTYPE** transitionMatrices,
                                                        int count) {

	const REALTYPE* Ievc = gIMatrices[eigenIndex];
	const REALTYPE* Evec = gEMatrices[eigenIndex];
	const REALTYPE* Eval = gEigenValues[eigenIndex];
	const REALTYPE* EvalImag = Eval + kStateCount;
    for (int u = 0; u < count; u++) {
        REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
        const double edgeLength = edgeLengths[u];
        int n = 0;
        for (int l = 0; l < kCategoryCount; l++) {
			const REALTYPE distance = categoryRates[l] * edgeLength;
        	for(int i=0; i<kStateCount; i++) {
        		if (!isComplex || EvalImag[i] == 0) {
        			const REALTYPE tmp = exp(Eval[i] * distance);
        			for(int j=0; j<kStateCount; j++) {
        				matrixTmp[i*kStateCount+j] = Ievc[i*kStateCount+j] * tmp;
        			}
        		} else {
        			// 2 x 2 conjugate block
        			int i2 = i + 1;
        			const REALTYPE b = EvalImag[i];
        			const REALTYPE expat = exp(Eval[i] * distance);
        			const REALTYPE expatcosbt = expat * cos(b * distance);
        			const REALTYPE expatsinbt = expat * sin(b * distance);
        			for(int j=0; j<kStateCount; j++) {
        				matrixTmp[ i*kStateCount+j] = expatcosbt * Ievc[ i*kStateCount+j] +
        						                      expatsinbt * Ievc[i2*kStateCount+j];
        				matrixTmp[i2*kStateCount+j] = expatcosbt * Ievc[i2*kStateCount+j] -
												      expatsinbt * Ievc[ i*kStateCount+j];
        			}
        			i++; // processed two conjugate rows
        		}
        	}

#ifdef DEBUG_COMPLEX
           	fprintf(stderr,"[");
            	for(int i=0; i<16; i++)
            		fprintf(stderr," %7.5e,",matrixTmp[i]);
            	fprintf(stderr,"] -- complex debug\n");
            	exit(0);
#endif


            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {
                    REALTYPE sum = 0.0;
                    for (int k = 0; k < kStateCount; k++)
                        sum += Evec[i*kStateCount+k] * matrixTmp[k*kStateCount+j];
                    if (sum > 0)
                        transitionMat[n] = sum;
                    else
                        transitionMat[n] = 0;
                    n++;
                }
if (T_PAD != 0) {
                transitionMat[n] = 1.0;
                n += T_PAD;
}
            }
        }

        if (DEBUGGING_OUTPUT) {
        	int kMatrixSize = kStateCount * kStateCount;
            fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
            for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
        }
    }
}